

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_doc(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,size_t id)

{
  size_t *psVar1;
  Tree *pTVar2;
  NodeType_e NVar3;
  code *pcVar4;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location loc_10;
  bool bVar5;
  error_flags eVar6;
  size_t sVar7;
  csubstr *pcVar8;
  NodeScalar *pNVar9;
  Tree *pTVar10;
  
  pTVar10 = this->m_tree;
  if ((id == 0xffffffffffffffff) || (pTVar10->m_cap <= id)) {
    eVar6 = get_error_flags();
    if ((eVar6 & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc.name.str = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc);
  }
  if ((pTVar10->m_buf[id].m_type.type & DOC) == NOTYPE) {
    eVar6 = get_error_flags();
    if ((eVar6 & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    loc_00.super_LineCol.col = 0;
    loc_00.super_LineCol.offset = SUB168(ZEXT816(0x58a3) << 0x40,0);
    loc_00.super_LineCol.line = SUB168(ZEXT816(0x58a3) << 0x40,8);
    loc_00.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_00.name.len = 0x65;
    error("check failed: m_tree->is_doc(id)",0x20,loc_00);
  }
  bVar5 = Tree::is_root(this->m_tree,id);
  if (!bVar5) {
    pTVar10 = this->m_tree;
    sVar7 = Tree::parent(pTVar10,id);
    if ((sVar7 == 0xffffffffffffffff) || (pTVar10->m_cap <= sVar7)) {
      eVar6 = get_error_flags();
      if ((eVar6 & 1) != 0) {
        bVar5 = is_debugger_attached();
        if (bVar5) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      loc_01.super_LineCol.col = 0;
      loc_01.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_01.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_01.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_01.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_01);
    }
    if ((~(int)pTVar10->m_buf[sVar7].m_type.type & 0x28U) != 0) {
      eVar6 = get_error_flags();
      if ((eVar6 & 1) != 0) {
        bVar5 = is_debugger_attached();
        if (bVar5) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      loc_02.super_LineCol.col = 0;
      loc_02.super_LineCol.offset = SUB168(ZEXT816(0x58a6) << 0x40,0);
      loc_02.super_LineCol.line = SUB168(ZEXT816(0x58a6) << 0x40,8);
      loc_02.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_02.name.len = 0x65;
      error("check failed: m_tree->is_stream(m_tree->parent(id))",0x33,loc_02);
    }
    std::ostream::write((char *)((this->
                                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ).m_stream + 0x10),0x1fd1a8);
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 3;
  }
  pTVar10 = this->m_tree;
  if ((id == 0xffffffffffffffff) || (pTVar10->m_cap <= id)) {
    eVar6 = get_error_flags();
    if ((eVar6 & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar4 = (code *)swi(3);
        (*pcVar4)();
        return;
      }
    }
    loc_03.super_LineCol.col = 0;
    loc_03.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_03.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_03.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_03.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_03);
  }
  pTVar2 = this->m_tree;
  bVar5 = pTVar2->m_cap <= id;
  if ((pTVar10->m_buf[id].m_type.type & VAL) == NOTYPE) {
    pTVar10 = pTVar2;
    if (bVar5 || id == 0xffffffffffffffff) {
      eVar6 = get_error_flags();
      if ((eVar6 & 1) != 0) {
        bVar5 = is_debugger_attached();
        if (bVar5) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      loc_04.super_LineCol.col = 0;
      loc_04.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_04.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_04.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_04.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_04);
      pTVar10 = this->m_tree;
    }
    NVar3 = pTVar2->m_buf[id].m_type.type;
    if ((NVar3 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar3 >> 0xb & 1) != 0) {
      bVar5 = Tree::is_root(pTVar10,id);
      if (!bVar5) {
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream + '\x10');
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
      }
      pcVar8 = Tree::val_tag(this->m_tree,id);
      _write_tag(this,*pcVar8);
      pTVar10 = this->m_tree;
    }
    if ((id == 0xffffffffffffffff) || (pTVar10->m_cap <= id)) {
      eVar6 = get_error_flags();
      if ((eVar6 & 1) != 0) {
        bVar5 = is_debugger_attached();
        if (bVar5) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      loc_05.super_LineCol.col = 0;
      loc_05.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_05.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_05.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_05.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_05);
    }
    NVar3 = pTVar10->m_buf[id].m_type.type;
    if ((NVar3 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar3 >> 9 & 1) != 0) {
      bVar5 = Tree::is_root(this->m_tree,id);
      if (!bVar5) {
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream + '\x10');
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
      }
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + 1;
      pcVar8 = Tree::val_anchor(this->m_tree,id);
      sVar7 = pcVar8->len;
      if (pcVar8->str != (char *)0x0 && sVar7 != 0) {
        std::ostream::write((char *)((this->
                                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ).m_stream + 0x10),(long)pcVar8->str);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + sVar7;
      }
    }
  }
  else {
    if (bVar5 || id == 0xffffffffffffffff) {
      eVar6 = get_error_flags();
      if ((eVar6 & 1) != 0) {
        bVar5 = is_debugger_attached();
        if (bVar5) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      loc_06.super_LineCol.col = 0;
      loc_06.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_06.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_06.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_06.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_06);
    }
    if ((pTVar2->m_buf[id].m_type.type & VAL) == NOTYPE) {
      eVar6 = get_error_flags();
      if ((eVar6 & 1) != 0) {
        bVar5 = is_debugger_attached();
        if (bVar5) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      loc_07.super_LineCol.col = 0;
      loc_07.super_LineCol.offset = SUB168(ZEXT816(0x58bb) << 0x40,0);
      loc_07.super_LineCol.line = SUB168(ZEXT816(0x58bb) << 0x40,8);
      loc_07.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_07.name.len = 0x65;
      error("check failed: m_tree->has_val(id)",0x21,loc_07);
    }
    pTVar10 = this->m_tree;
    if ((id == 0xffffffffffffffff) || (pTVar10->m_cap <= id)) {
      eVar6 = get_error_flags();
      if ((eVar6 & 1) != 0) {
        bVar5 = is_debugger_attached();
        if (bVar5) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      loc_08.super_LineCol.col = 0;
      loc_08.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_08.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_08.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_08.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_08);
    }
    if ((pTVar10->m_buf[id].m_type.type & KEY) != NOTYPE) {
      eVar6 = get_error_flags();
      if ((eVar6 & 1) != 0) {
        bVar5 = is_debugger_attached();
        if (bVar5) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      loc_09.super_LineCol.col = 0;
      loc_09.super_LineCol.offset = SUB168(ZEXT816(0x58bc) << 0x40,0);
      loc_09.super_LineCol.line = SUB168(ZEXT816(0x58bc) << 0x40,8);
      loc_09.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_09.name.len = 0x65;
      error("check failed: !m_tree->has_key(id)",0x22,loc_09);
    }
    bVar5 = Tree::is_root(this->m_tree,id);
    if (!bVar5) {
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + 1;
    }
    pNVar9 = Tree::valsc(this->m_tree,id);
    pTVar10 = this->m_tree;
    if ((id == 0xffffffffffffffff) || (pTVar10->m_cap <= id)) {
      eVar6 = get_error_flags();
      if ((eVar6 & 1) != 0) {
        bVar5 = is_debugger_attached();
        if (bVar5) {
          pcVar4 = (code *)swi(3);
          (*pcVar4)();
          return;
        }
      }
      loc_10.super_LineCol.col = 0;
      loc_10.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_10.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_10.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_10.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_10);
    }
    _write(this,(int)pNVar9,(void *)(ulong)((uint)pTVar10->m_buf[id].m_type.type & 0x5541281),0);
  }
  std::ostream::put((char)(this->
                          super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).m_stream + '\x10');
  psVar1 = &(this->
            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void Emitter<Writer>::_write_doc(size_t id)
{
    RYML_ASSERT(m_tree->is_doc(id));
    if(!m_tree->is_root(id))
    {
        RYML_ASSERT(m_tree->is_stream(m_tree->parent(id)));
        this->Writer::_do_write("---");
    }
    if(!m_tree->has_val(id)) // this is more frequent
    {
        if(m_tree->has_val_tag(id))
        {
            if(!m_tree->is_root(id))
                this->Writer::_do_write(' ');
            _write_tag(m_tree->val_tag(id));
        }
        if(m_tree->has_val_anchor(id))
        {
            if(!m_tree->is_root(id))
                this->Writer::_do_write(' ');
            this->Writer::_do_write('&');
            this->Writer::_do_write(m_tree->val_anchor(id));
        }
    }
    else // docval
    {
        RYML_ASSERT(m_tree->has_val(id));
        RYML_ASSERT(!m_tree->has_key(id));
        if(!m_tree->is_root(id))
            this->Writer::_do_write(' ');
        _writev(id, 0);
    }
    this->Writer::_do_write('\n');
}